

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O2

MDDEntry * __thiscall ASDCP::Dictionary::FindULAnyVersion(Dictionary *this,byte_t *ul_buf)

{
  _Rb_tree_node_base *this_00;
  bool bVar1;
  const_iterator cVar2;
  ILogSink *this_01;
  char *pcVar3;
  MDDEntry *pMVar4;
  byte_t search_ul [16];
  UL local_98;
  char buf [64];
  
  if (*this->m_MDD_Table[0].name == '\0') {
    __assert_fail("m_MDD_Table[0].name[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                  ,0x130,
                  "const ASDCP::MDDEntry *ASDCP::Dictionary::FindULAnyVersion(const byte_t *) const"
                 );
  }
  local_98.super_Identifier<16U>.m_HasValue = true;
  local_98.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)ul_buf;
  local_98.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(ul_buf + 8);
  local_98.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  buf[8] = '\x01';
  buf._9_8_ = *(ulong *)ul_buf & 0xffffffffffffff;
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf._0_8_ = &PTR__IArchive_002112c8;
  cVar2 = std::
          _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
          ::lower_bound((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                         *)this,(key_type *)buf);
  pMVar4 = (MDDEntry *)0x0;
  while( true ) {
    if ((_Rb_tree_header *)cVar2._M_node == &(this->m_md_lookup)._M_t._M_impl.super__Rb_tree_header)
    {
      if (pMVar4 == (MDDEntry *)0x0) {
        this_01 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar3 = UL::EncodeString(&local_98,buf,0x40);
        pMVar4 = (MDDEntry *)0x0;
        Kumu::ILogSink::Warn(this_01,"UL Dictionary: unknown UL: %s\n",pcVar3);
      }
      return pMVar4;
    }
    this_00 = cVar2._M_node + 1;
    bVar1 = UL::MatchExact((UL *)this_00,&local_98);
    if (bVar1) break;
    bVar1 = UL::MatchIgnoreStream((UL *)this_00,&local_98);
    if (pMVar4 == (MDDEntry *)0x0) {
      if ((bVar1) || (bVar1 = UL::MatchIgnorePlaceholder((UL *)this_00,&local_98), bVar1)) {
        pMVar4 = this->m_MDD_Table + cVar2._M_node[2]._M_color;
      }
      else {
        pMVar4 = (MDDEntry *)0x0;
      }
    }
    else if (!bVar1) {
      return pMVar4;
    }
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
  }
  return this->m_MDD_Table + cVar2._M_node[2]._M_color;
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindULAnyVersion(const byte_t* ul_buf) const
{
  assert(m_MDD_Table[0].name[0]);
  byte_t search_ul[SMPTE_UL_LENGTH];
  memcpy(search_ul, ul_buf, SMPTE_UL_LENGTH);
  memset(search_ul+7, 0, SMPTE_UL_LENGTH-7);

  UL target(ul_buf);
  const ASDCP::MDDEntry *found_entry = 0;

  std::map<UL, ui32_t>::const_iterator lower = m_md_lookup.lower_bound(UL(search_ul));

  for ( ; lower != m_md_lookup.end(); ++lower )
    {
      if ( lower->first.MatchExact(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	  break;
	}
      else if ( found_entry == 0 && lower->first.MatchIgnoreStream(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	}
      else if ( found_entry == 0 && lower->first.MatchIgnorePlaceholder(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	}
      else if ( found_entry != 0 && ! lower->first.MatchIgnoreStream(target) )
	{
	  break;
	}
    }

  if ( found_entry == 0 )
    {
      char buf[64];
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL: %s\n", target.EncodeString(buf, 64));
    }

  return found_entry;
}